

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

_Bool plutovg_surface_write_to_png(plutovg_surface_t *surface,char *filename)

{
  int iVar1;
  int success;
  char *filename_local;
  plutovg_surface_t *surface_local;
  
  plutovg_surface_write_begin(surface);
  iVar1 = stbi_write_png(filename,surface->width,surface->height,4,surface->data,surface->stride);
  plutovg_surface_write_end(surface);
  return iVar1 != 0;
}

Assistant:

bool plutovg_surface_write_to_png(const plutovg_surface_t* surface, const char* filename)
{
    plutovg_surface_write_begin(surface);
    int success = stbi_write_png(filename, surface->width, surface->height, 4, surface->data, surface->stride);
    plutovg_surface_write_end(surface);
    return success;
}